

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O2

barindex __thiscall BmsUtil::LCM(BmsUtil *this,barindex x,barindex y)

{
  barindex bVar1;
  int iVar2;
  barindex x_00;
  
  x_00 = (barindex)this;
  iVar2 = 0;
  if (x != 0 && x_00 != 0) {
    bVar1 = GCD(x_00,x);
    iVar2 = (x * x_00) / bVar1;
  }
  return iVar2;
}

Assistant:

barindex
BmsUtil::LCM(barindex x, barindex y)
{
	if (x == 0 || y == 0) { return 0; }
	return x * y / BmsUtil::GCD(x, y);
}